

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestDeprecatedFields::Clear(TestDeprecatedFields *this)

{
  TestAllTypes_NestedMessage *this_00;
  TestDeprecatedFields *this_01;
  char *pcVar1;
  anon_union_64_1_493b367e_for_TestDeprecatedFields_3 aVar2;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.deprecated_repeated_string_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x3) != (undefined1  [64])0x0) {
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
      this_00 = (this->field_0)._impl_.deprecated_message_;
      if (this_00 == (TestAllTypes_NestedMessage *)0x0) {
        pcVar1 = "from._impl_.deprecated_message_ != nullptr";
        line = 0x2dd1;
        goto LAB_00a111d3;
      }
      proto2_unittest::TestAllTypes_NestedMessage::Clear(this_00);
    }
    if (((undefined1  [64])aVar2 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      this_01 = (this->field_0)._impl_.nested_;
      if (this_01 == (TestDeprecatedFields *)0x0) {
        pcVar1 = "from._impl_.nested_ != nullptr";
        line = 0x2dd5;
LAB_00a111d3:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
                   ,line,pcVar1 + 5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      Clear(this_01);
    }
  }
  (this->field_0)._impl_.deprecated_int32_ = 0;
  (this->field_0)._impl_._oneof_case_[0] = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestDeprecatedFields::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestDeprecatedFields)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.deprecated_repeated_string_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.deprecated_message_ != nullptr);
      _impl_.deprecated_message_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.nested_ != nullptr);
      _impl_.nested_->Clear();
    }
  }
  _impl_.deprecated_int32_ = 0;
  clear_oneof_fields();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}